

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O0

void bench_keygen_run(void *arg,int iters)

{
  int iVar1;
  int in_ESI;
  undefined8 *in_RDI;
  secp256k1_pubkey pubkey;
  size_t len;
  uchar pub33 [33];
  bench_data *data;
  int i;
  undefined1 local_90 [64];
  undefined8 local_50;
  undefined1 local_48;
  undefined8 local_47;
  undefined8 local_3f;
  undefined8 local_37;
  undefined8 local_2f;
  undefined8 *local_18;
  int local_10;
  int local_c;
  
  local_10 = 0;
  local_18 = in_RDI;
  local_c = in_ESI;
  while( true ) {
    if (local_c <= local_10) {
      return;
    }
    local_50 = 0x21;
    iVar1 = secp256k1_ec_pubkey_create(*local_18,local_90,local_18 + 5);
    if (iVar1 == 0) break;
    iVar1 = secp256k1_ec_pubkey_serialize(*local_18,&local_48,&local_50,local_90,0x102);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/bench.c"
              ,0x92,
              "test condition failed: secp256k1_ec_pubkey_serialize(data->ctx, pub33, &len, &pubkey, SECP256K1_EC_COMPRESSED)"
             );
      abort();
    }
    local_18[5] = local_47;
    local_18[6] = local_3f;
    local_18[7] = local_37;
    local_18[8] = local_2f;
    local_10 = local_10 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/bench.c"
          ,0x91,"test condition failed: secp256k1_ec_pubkey_create(data->ctx, &pubkey, data->key)");
  abort();
}

Assistant:

static void bench_keygen_run(void *arg, int iters) {
    int i;
    bench_data *data = (bench_data*)arg;

    for (i = 0; i < iters; i++) {
        unsigned char pub33[33];
        size_t len = 33;
        secp256k1_pubkey pubkey;
        CHECK(secp256k1_ec_pubkey_create(data->ctx, &pubkey, data->key));
        CHECK(secp256k1_ec_pubkey_serialize(data->ctx, pub33, &len, &pubkey, SECP256K1_EC_COMPRESSED));
        memcpy(data->key, pub33 + 1, 32);
    }
}